

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O1

DecoratorDataHandle __thiscall
Rml::DecoratorStraightGradient::GenerateElementData
          (DecoratorStraightGradient *this,Element *element,BoxArea paint_area)

{
  ColourbPremultiplied CVar1;
  ComputedValues *pCVar2;
  RenderManager *this_00;
  RenderManager *mesh_00;
  ColourbPremultiplied v0;
  long lVar3;
  ColourbPremultiplied v1;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Mesh mesh;
  RenderBox render_box;
  float local_98;
  float fStack_94;
  Mesh local_88;
  RenderBox local_58;
  
  Element::GetRenderBox(&local_58,element,paint_area,0);
  pCVar2 = Element::GetComputedValues(element);
  fVar7 = (pCVar2->inherited).opacity;
  local_88.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_88.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  MeshUtilities::GenerateBackground(&local_88,&local_58,(ColourbPremultiplied)0xff000000);
  fVar5 = (float)(this->start).alpha * fVar7;
  fVar6 = fVar5 / 255.0;
  fVar7 = (float)(this->stop).alpha * fVar7;
  fVar8 = fVar7 / 255.0;
  v0 = (ColourbPremultiplied)
       ((int)((float)(this->start).red * fVar6) & 0xffU |
       ((int)((float)(this->start).green * fVar6) & 0xffU) << 8 |
       ((int)((float)(this->start).blue * fVar6) & 0xffU) << 0x10 | (int)fVar5 << 0x18);
  v1 = (ColourbPremultiplied)
       ((int)((float)(this->stop).red * fVar8) & 0xffU |
       ((int)((float)(this->stop).green * fVar8) & 0xffU) << 8 |
       ((int)((float)(this->stop).blue * fVar8) & 0xffU) << 0x10 | (int)fVar7 << 0x18);
  if (this->direction == Horizontal) {
    if (0 < (int)((ulong)((long)local_88.vertices.
                                super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_88.vertices.
                               super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl
                               .super__Vector_impl_data._M_start) >> 2) * -0x33333333) {
      lVar4 = 0;
      lVar3 = 0;
      do {
        local_98 = local_58.fill_size.x;
        local_98 = (*(float *)((long)&((local_88.vertices.
                                        super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->position).x +
                              lVar4) - local_58.border_widths._M_elems[3]) / local_98;
        fVar7 = 1.0;
        if (local_98 <= 1.0) {
          fVar7 = local_98;
        }
        CVar1 = Math::RoundedLerp((float)(~-(uint)(local_98 < 0.0) & (uint)fVar7),v0,v1);
        *(ColourbPremultiplied *)
         (&((local_88.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl
             .super__Vector_impl_data._M_start)->colour).red + lVar4) = CVar1;
        lVar3 = lVar3 + 1;
        lVar4 = lVar4 + 0x14;
      } while (lVar3 < (int)((ulong)((long)local_88.vertices.
                                           super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_88.vertices.
                                          super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                       -0x33333333);
    }
  }
  else if ((this->direction == Vertical) &&
          (0 < (int)((ulong)((long)local_88.vertices.
                                   super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_88.vertices.
                                  super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2) * -0x33333333)) {
    fStack_94 = local_58.fill_size.y;
    lVar4 = 0;
    lVar3 = 0;
    do {
      fVar5 = (*(float *)((long)&((local_88.vertices.
                                   super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->position).y + lVar4) -
              local_58.border_widths._M_elems[0]) / fStack_94;
      fVar7 = 1.0;
      if (fVar5 <= 1.0) {
        fVar7 = fVar5;
      }
      CVar1 = Math::RoundedLerp((float)(~-(uint)(fVar5 < 0.0) & (uint)fVar7),v0,v1);
      *(ColourbPremultiplied *)
       (&((local_88.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
           super__Vector_impl_data._M_start)->colour).red + lVar4) = CVar1;
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x14;
    } while (lVar3 < (int)((ulong)((long)local_88.vertices.
                                         super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_88.vertices.
                                        super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                     -0x33333333);
  }
  this_00 = (RenderManager *)operator_new(0x10);
  mesh_00 = Element::GetRenderManager(element);
  RenderManager::MakeGeometry(this_00,(Mesh *)mesh_00);
  if (local_88.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_88.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_88.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.vertices.
                          super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.vertices.
                          super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (DecoratorDataHandle)this_00;
}

Assistant:

DecoratorDataHandle DecoratorStraightGradient::GenerateElementData(Element* element, BoxArea paint_area) const
{
	const RenderBox render_box = element->GetRenderBox(paint_area);
	const ComputedValues& computed = element->GetComputedValues();
	const float opacity = computed.opacity();

	Mesh mesh;
	MeshUtilities::GenerateBackground(mesh, render_box, ColourbPremultiplied());

	ColourbPremultiplied colour_start = start.ToPremultiplied(opacity);
	ColourbPremultiplied colour_stop = stop.ToPremultiplied(opacity);

	const Vector2f offset = render_box.GetFillOffset();
	const Vector2f size = render_box.GetFillSize();

	Vector<Vertex>& vertices = mesh.vertices;

	if (direction == Direction::Horizontal)
	{
		for (int i = 0; i < (int)vertices.size(); i++)
		{
			const float t = Math::Clamp((vertices[i].position.x - offset.x) / size.x, 0.0f, 1.0f);
			vertices[i].colour = Math::RoundedLerp(t, colour_start, colour_stop);
		}
	}
	else if (direction == Direction::Vertical)
	{
		for (int i = 0; i < (int)vertices.size(); i++)
		{
			const float t = Math::Clamp((vertices[i].position.y - offset.y) / size.y, 0.0f, 1.0f);
			vertices[i].colour = Math::RoundedLerp(t, colour_start, colour_stop);
		}
	}

	Geometry* geometry = new Geometry(element->GetRenderManager()->MakeGeometry(std::move(mesh)));

	return reinterpret_cast<DecoratorDataHandle>(geometry);
}